

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::emplace<QString,long_long&,int&,int&>
          (QMovableArrayOps<QTimeZonePrivate::Data> *this,qsizetype i,QString *args,longlong *args_1
          ,int *args_2,int *args_3)

{
  bool bVar1;
  qsizetype qVar2;
  long in_RSI;
  Data *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  Data tmp;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  Data *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 uVar3;
  GrowthPosition in_stack_ffffffffffffff5c;
  QArrayDataPointer<QTimeZonePrivate::Data> *in_stack_ffffffffffffff60;
  Inserter local_60;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<QTimeZonePrivate::Data>::needsDetach
                    ((QArrayDataPointer<QTimeZonePrivate::Data> *)in_stack_ffffffffffffff40);
  if (!bVar1) {
    if ((in_RSI == (in_RDI->abbreviation).d.size) &&
       (qVar2 = QArrayDataPointer<QTimeZonePrivate::Data>::freeSpaceAtEnd
                          ((QArrayDataPointer<QTimeZonePrivate::Data> *)
                           CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48)),
       qVar2 != 0)) {
      QArrayDataPointer<QTimeZonePrivate::Data>::end
                ((QArrayDataPointer<QTimeZonePrivate::Data> *)in_stack_ffffffffffffff40);
      QTimeZonePrivate::Data::Data
                (in_RDI,(QString *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                 (qint64)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                 in_stack_ffffffffffffff38);
      (in_RDI->abbreviation).d.size = (in_RDI->abbreviation).d.size + 1;
      goto LAB_0075d3ef;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<QTimeZonePrivate::Data>::freeSpaceAtBegin
                          ((QArrayDataPointer<QTimeZonePrivate::Data> *)
                           CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48)),
       qVar2 != 0)) {
      QArrayDataPointer<QTimeZonePrivate::Data>::begin
                ((QArrayDataPointer<QTimeZonePrivate::Data> *)0x75d250);
      QTimeZonePrivate::Data::Data
                (in_RDI,(QString *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                 (qint64)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                 in_stack_ffffffffffffff38);
      (in_RDI->abbreviation).d.ptr = (in_RDI->abbreviation).d.ptr + -0x18;
      (in_RDI->abbreviation).d.size = (in_RDI->abbreviation).d.size + 1;
      goto LAB_0075d3ef;
    }
  }
  memset(local_38,0xaa,0x30);
  QTimeZonePrivate::Data::Data
            (in_RDI,(QString *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             (qint64)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  bVar1 = (in_RDI->abbreviation).d.size != 0;
  uVar3 = bVar1 && in_RSI == 0;
  QArrayDataPointer<QTimeZonePrivate::Data>::detachAndGrow
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(qsizetype)in_RDI,
             (Data **)CONCAT17(uVar3,in_stack_ffffffffffffff48),
             (QArrayDataPointer<QTimeZonePrivate::Data> *)in_stack_ffffffffffffff40);
  if (bVar1 && in_RSI == 0) {
    QArrayDataPointer<QTimeZonePrivate::Data>::begin
              ((QArrayDataPointer<QTimeZonePrivate::Data> *)0x75d33f);
    QTimeZonePrivate::Data::Data
              (in_stack_ffffffffffffff40,
               (Data *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    (in_RDI->abbreviation).d.ptr = (in_RDI->abbreviation).d.ptr + -0x18;
    (in_RDI->abbreviation).d.size = (in_RDI->abbreviation).d.size + 1;
  }
  else {
    Inserter::Inserter((Inserter *)in_RDI,
                       (QArrayDataPointer<QTimeZonePrivate::Data> *)
                       CONCAT17(uVar3,in_stack_ffffffffffffff48),
                       (qsizetype)in_stack_ffffffffffffff40,
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    Inserter::insertOne((Inserter *)in_stack_ffffffffffffff40,
                        (Data *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    Inserter::~Inserter(&local_60);
  }
  QTimeZonePrivate::Data::~Data((Data *)0x75d3ef);
LAB_0075d3ef:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }